

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_main.cpp
# Opt level: O2

void swrenderer::R_SetupBuffer(void)

{
  int fuzzoff;
  BYTE *pBVar1;
  DCanvas *pDVar2;
  int iVar3;
  int i;
  long lVar4;
  long lVar5;
  long lVar6;
  
  fuzzoff = RenderTarget->Pitch;
  pBVar1 = RenderTarget->Buffer;
  if (pBVar1 != (BYTE *)0x0 || drawerargs::dc_pitch != fuzzoff) {
    lVar4 = (long)viewwindowy;
    lVar6 = (long)viewwindowx;
    if (drawerargs::dc_pitch != fuzzoff) {
      drawerargs::dc_pitch = fuzzoff;
      R_InitFuzzTable(fuzzoff);
    }
    pDVar2 = RenderTarget;
    iVar3 = 0;
    drawerargs::dc_destorg = pBVar1 + lVar4 * fuzzoff + lVar6;
    for (lVar5 = 0; lVar5 < pDVar2->Height; lVar5 = lVar5 + 1) {
      (&ylookup)[lVar5] = iVar3;
      iVar3 = iVar3 + fuzzoff;
    }
  }
  return;
}

Assistant:

void R_SetupBuffer ()
{
	static BYTE *lastbuff = NULL;

	int pitch = RenderTarget->GetPitch();
	BYTE *lineptr = RenderTarget->GetBuffer() + viewwindowy*pitch + viewwindowx;

	if (dc_pitch != pitch || lineptr != lastbuff)
	{
		if (dc_pitch != pitch)
		{
			dc_pitch = pitch;
			R_InitFuzzTable (pitch);
		}
		dc_destorg = lineptr;
		for (int i = 0; i < RenderTarget->GetHeight(); i++)
		{
			ylookup[i] = i * pitch;
		}
	}
}